

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

bool __thiscall soul::AST::TypeMetaFunction::isSizeOfUnsizedType(TypeMetaFunction *this)

{
  int iVar1;
  Type local_28;
  
  if ((this->operation == size) &&
     (iVar1 = (*(((this->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar1 != '\0')) {
    getSourceType(&local_28,this);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_28.structure);
    return local_28.boundingSize == 0 && local_28.category == array;
  }
  return false;
}

Assistant:

bool isSizeOfUnsizedType() const
        {
            return operation == Op::size && source->isResolved() && getSourceType().isUnsizedArray();
        }